

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shared_ptr.hpp
# Opt level: O2

void __thiscall
boost::shared_ptr<boost::unit_test::test_unit_fixture>::
shared_ptr<boost::unit_test::framework::impl::global_fixture_handle>
          (shared_ptr<boost::unit_test::test_unit_fixture> *this,global_fixture_handle *p)

{
  this->px = &p->super_test_unit_fixture;
  (this->pn).pi_ = (sp_counted_base *)0x0;
  detail::
  sp_pointer_construct<boost::unit_test::test_unit_fixture,boost::unit_test::framework::impl::global_fixture_handle>
            (this,p,&this->pn);
  return;
}

Assistant:

explicit shared_ptr( Y * p ): px( p ), pn() // Y must be complete
    {
        boost::detail::sp_pointer_construct( this, p, pn );
    }